

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

reference __thiscall
llvm::SmallVectorTemplateCommon<llvm::DWARFFormValue,_void>::back
          (SmallVectorTemplateCommon<llvm::DWARFFormValue,_void> *this)

{
  ulong uVar1;
  
  uVar1 = (ulong)(this->super_SmallVectorBase).Size;
  if (uVar1 != 0) {
    return (reference)((long)(this->super_SmallVectorBase).BeginX + uVar1 * 0x30 + -0x30);
  }
  __assert_fail("!empty()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/third_party/llvm-project/include/llvm/ADT/SmallVector.h"
                ,0xa7,
                "reference llvm::SmallVectorTemplateCommon<llvm::DWARFFormValue>::back() [T = llvm::DWARFFormValue]"
               );
}

Assistant:

LLVM_NODISCARD bool empty() const { return !Size; }